

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O3

void __thiscall
pstd::vector<pbrt::RGB,_pstd::pmr::polymorphic_allocator<pbrt::RGB>_>::reserve
          (vector<pbrt::RGB,_pstd::pmr::polymorphic_allocator<pbrt::RGB>_> *this,size_t n)

{
  memory_resource *pmVar1;
  RGB *pRVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar5;
  ulong uVar6;
  RGB *pRVar4;
  
  if (this->nAlloc < n) {
    pmVar1 = (this->alloc).memoryResource;
    iVar3 = (*pmVar1->_vptr_memory_resource[2])(pmVar1,n * 0xc,4);
    pRVar4 = (RGB *)CONCAT44(extraout_var,iVar3);
    if (this->nStored != 0) {
      lVar5 = 0;
      uVar6 = 0;
      do {
        pRVar2 = this->ptr;
        uVar6 = uVar6 + 1;
        *(undefined4 *)((long)&pRVar4->b + lVar5) = *(undefined4 *)((long)&pRVar2->b + lVar5);
        *(undefined8 *)((long)&pRVar4->r + lVar5) = *(undefined8 *)((long)&pRVar2->r + lVar5);
        lVar5 = lVar5 + 0xc;
      } while (uVar6 < this->nStored);
    }
    pmVar1 = (this->alloc).memoryResource;
    (*pmVar1->_vptr_memory_resource[3])(pmVar1,this->ptr,this->nAlloc * 0xc,4);
    this->nAlloc = n;
    this->ptr = pRVar4;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }